

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this,string *pfile,string *home)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  pointer ppVar7;
  undefined8 *puVar8;
  mapped_type *pmVar9;
  RuleHash hash;
  string fpath;
  iterator local_2b8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_2b0;
  iterator local_2a8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
  local_2a0;
  const_iterator rhi;
  undefined1 local_278 [8];
  string fname;
  string line;
  long local_228;
  ifstream fin;
  string *home_local;
  string *pfile_local;
  cmGlobalGenerator *this_local;
  
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar5,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_278);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,(string *)((long)&fname.field_2 + 8),(bool *)0x0
                              ,-1), bVar3) {
      uVar6 = std::__cxx11::string::size();
      if ((0x21 < uVar6) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)((long)&fname.field_2 + 8)),
         *pcVar5 != '#')) {
        std::__cxx11::string::substr((ulong)&rhi,(ulong)((long)&fname.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_278,(string *)&rhi);
        std::__cxx11::string::~string((string *)&rhi);
        local_2a8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::find(&this->RuleHashes,(key_type *)local_278);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
        ::_Rb_tree_const_iterator(&local_2a0,&local_2a8);
        local_2b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::end(&this->RuleHashes);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
        ::_Rb_tree_const_iterator(&local_2b0,&local_2b8);
        bVar3 = std::operator!=(&local_2a0,&local_2b0);
        if (bVar3) {
          pcVar5 = (char *)std::__cxx11::string::c_str();
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
                   ::operator->(&local_2a0);
          iVar4 = strncmp(pcVar5,(ppVar7->second).Data,0x20);
          if (iVar4 != 0) {
            cmsys::SystemTools::CollapseFullPath
                      ((string *)((long)&fpath.field_2 + 8),(string *)local_278,home);
            std::__cxx11::string::operator=
                      ((string *)local_278,(string *)(fpath.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
            cmsys::SystemTools::RemoveFile((string *)local_278);
          }
        }
        else {
          cmsys::SystemTools::CollapseFullPath
                    ((string *)(hash.Data + 0x18),(string *)local_278,home);
          bVar3 = cmsys::SystemTools::FileExists((string *)(hash.Data + 0x18));
          if (bVar3) {
            puVar8 = (undefined8 *)std::__cxx11::string::c_str();
            uVar1 = *puVar8;
            hash.Data._0_8_ = puVar8[1];
            hash.Data._8_8_ = puVar8[2];
            hash.Data._16_8_ = puVar8[3];
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                     ::operator[](&this->RuleHashes,(key_type *)local_278);
            *(undefined8 *)pmVar9->Data = uVar1;
            *(undefined8 *)(pmVar9->Data + 8) = hash.Data._0_8_;
            *(undefined8 *)(pmVar9->Data + 0x10) = hash.Data._8_8_;
            *(undefined8 *)(pmVar9->Data + 0x18) = hash.Data._16_8_;
          }
          std::__cxx11::string::~string((string *)(hash.Data + 0x18));
        }
      }
    }
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  }
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes(std::string const& pfile,
                                        std::string const& home)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(pfile.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(pfile.c_str());
#endif
  if (!fin) {
    return;
  }
  std::string line;
  std::string fname;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Line format is a 32-byte hex string followed by a space
    // followed by a file name (with no escaping).

    // Skip blank and comment lines.
    if (line.size() < 34 || line[0] == '#') {
      continue;
    }

    // Get the filename.
    fname = line.substr(33);

    // Look for a hash for this file's rule.
    std::map<std::string, RuleHash>::const_iterator rhi =
      this->RuleHashes.find(fname);
    if (rhi != this->RuleHashes.end()) {
      // Compare the rule hash in the file to that we were given.
      if (strncmp(line.c_str(), rhi->second.Data, 32) != 0) {
        // The rule has changed.  Delete the output so it will be
        // built again.
        fname = cmSystemTools::CollapseFullPath(fname, home);
        cmSystemTools::RemoveFile(fname);
      }
    } else {
      // We have no hash for a rule previously listed.  This may be a
      // case where a user has turned off a build option and might
      // want to turn it back on later, so do not delete the file.
      // Instead, we keep the rule hash as long as the file exists so
      // that if the feature is turned back on and the rule has
      // changed the file is still rebuilt.
      std::string fpath = cmSystemTools::CollapseFullPath(fname, home);
      if (cmSystemTools::FileExists(fpath)) {
        RuleHash hash;
        memcpy(hash.Data, line.c_str(), 32);
        this->RuleHashes[fname] = hash;
      }
    }
  }
}